

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

Vector3d *
RigidBodyDynamics::CalcPointVelocity
          (Model *model,VectorNd *Q,VectorNd *QDot,uint body_id,Vector3d *point_position,
          bool update_kinematics)

{
  bool bVar1;
  reference pvVar2;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *this;
  SpatialVector *in_RSI;
  Model *in_RDI;
  uint in_R8D;
  byte in_stack_00000008;
  bool in_stack_0000003f;
  Vector3d *in_stack_00000040;
  uint in_stack_0000004c;
  VectorNd *in_stack_00000050;
  Model *in_stack_00000058;
  bool in_stack_0000006f;
  Vector3d *in_stack_00000070;
  uint in_stack_0000007c;
  VectorNd *in_stack_00000080;
  Model *in_stack_00000088;
  SpatialVector point_spatial_velocity;
  Vector3d base_coords;
  uint fbody_id;
  Vector3d reference_point;
  uint reference_body_id;
  VectorNd *in_stack_00000298;
  VectorNd *in_stack_000002a0;
  VectorNd *in_stack_000002a8;
  Model *in_stack_000002b0;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffffe28;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *in_stack_fffffffffffffe30;
  Matrix3d *in_stack_fffffffffffffe38;
  Model *this_00;
  double *in_stack_fffffffffffffe68;
  double *in_stack_fffffffffffffe70;
  double *in_stack_fffffffffffffe78;
  Vector3_t *in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffeab;
  uint in_stack_fffffffffffffeac;
  VectorNd *in_stack_fffffffffffffeb0;
  Model *in_stack_fffffffffffffeb8;
  uint local_38;
  Model *this_01;
  
  this_00 = in_RDI;
  this_01 = in_RDI;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             (in_RSI[2].super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array +
             2),0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffe30);
  if ((in_stack_00000008 & 1) != 0) {
    UpdateKinematicsCustom(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298);
  }
  Vector3_t::Vector3_t
            ((Vector3_t *)in_stack_fffffffffffffe30,(Vector3_t *)in_stack_fffffffffffffe28);
  bVar1 = Model::IsFixedBodyId(this_00,(uint)((ulong)in_RDI >> 0x20));
  local_38 = in_R8D;
  if (bVar1) {
    pvVar2 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RSI[0x10].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array + 3),
                          (ulong)(in_R8D - *(int *)in_RSI[0x11].super_Matrix<double,_6,_1,_0,_6,_1>.
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array));
    local_38 = pvVar2->mMovableParent;
    CalcBodyToBaseCoordinates
              (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000040,
               in_stack_0000003f);
    CalcBaseToBodyCoordinates
              (in_stack_00000088,in_stack_00000080,in_stack_0000007c,in_stack_00000070,
               in_stack_0000006f);
    Vector3_t::operator=
              ((Vector3_t *)in_stack_fffffffffffffe30,(Vector3_t *)in_stack_fffffffffffffe28);
  }
  CalcBodyWorldOrientation
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             (bool)in_stack_fffffffffffffeab);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffe28);
  Matrix3_t::Matrix3_t<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Math::SpatialTransform::SpatialTransform
            ((SpatialTransform *)in_RDI,in_stack_fffffffffffffe38,
             (Vector3d *)in_stack_fffffffffffffe30);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             (in_RSI[2].super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array +
             2),(ulong)local_38);
  Math::SpatialTransform::apply((SpatialTransform *)this_01,in_RSI);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                   (in_stack_fffffffffffffe30,(Index)in_stack_fffffffffffffe28);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this,(Index)in_stack_fffffffffffffe28);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
            (this,(Index)in_stack_fffffffffffffe28);
  Vector3_t::Vector3_t
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  return (Vector3d *)this_00;
}

Assistant:

RBDL_DLLAPI Vector3d CalcPointVelocity (
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    unsigned int body_id,
    const Vector3d &point_position,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;
  assert (model.IsBodyId(body_id) || body_id == 0);
  assert (model.q_size == Q.size());
  assert (model.qdot_size == QDot.size());

  // Reset the velocity of the root body
  model.v[0].setZero();

  // update the Kinematics with zero acceleration
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  unsigned int reference_body_id = body_id;
  Vector3d reference_point = point_position;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
    Vector3d base_coords = 
      CalcBodyToBaseCoordinates(model, Q, body_id, point_position, false);
    reference_point =
      CalcBaseToBodyCoordinates(model, Q, reference_body_id, base_coords,false);
  }

  SpatialVector point_spatial_velocity = 
    SpatialTransform (
        CalcBodyWorldOrientation (model, Q, reference_body_id, false).transpose(), 
        reference_point).apply(model.v[reference_body_id]);

  return Vector3d (
      point_spatial_velocity[3],
      point_spatial_velocity[4],
      point_spatial_velocity[5]
      );
}